

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

int read2Dfield(FILE *in,double **field,size_t offX,size_t offY)

{
  size_t sVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  FILE *in_RDI;
  size_t k;
  size_t size [2];
  ulong local_40;
  ulong local_38;
  size_t local_30;
  long local_28;
  long local_20;
  long local_18;
  FILE *local_10;
  int local_4;
  
  if ((in_RDI == (FILE *)0x0) || (in_RSI == 0)) {
    local_4 = -1;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    sVar1 = fread(&local_38,8,2,in_RDI);
    if (sVar1 < 2) {
      local_4 = -1;
    }
    else {
      for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
        sVar1 = fread((void *)(*(long *)(local_18 + (local_40 + local_20) * 8) + local_28 * 8),8,
                      local_30,local_10);
        if (sVar1 != local_30) {
          return -1;
        }
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int read2Dfield (FILE *in, REAL **field, size_t offX, size_t offY)
{
	if (!in || !field)
		return -1;
	size_t size[2];
	if (fread(size,sizeof(size_t),2,in) < 2)
		return -1;
	for (size_t k = 0; k < size[0]; k++) /* Loop over lines */
	{
		if (fread(field[k+offX]+offY,sizeof(REAL),size[1],in) != size[1])
			return -1;
	}
	return 1;
}